

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O2

llama_tensor_weight * __thiscall
llama_model_loader::require_weight(llama_model_loader *this,char *name)

{
  llama_tensor_weight *plVar1;
  runtime_error *this_00;
  string sStack_38;
  
  plVar1 = get_weight(this,name);
  if (plVar1 != (llama_tensor_weight *)0x0) {
    return plVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  format_abi_cxx11_(&sStack_38,"%s: tensor \'%s\' not found","require_weight",name);
  std::runtime_error::runtime_error(this_00,(string *)&sStack_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const llama_model_loader::llama_tensor_weight & llama_model_loader::require_weight(const char * name) const {
    const llama_tensor_weight * weight = get_weight(name);
    if (!weight) {
        throw std::runtime_error(format("%s: tensor '%s' not found", __func__, name));
    }
    return *weight;
}